

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O0

void __thiscall Patch::Node::serialize(Node *this,Serializer *output)

{
  bool bVar1;
  pointer pTVar2;
  Serializer *output_local;
  Node *this_local;
  
  Point::serialize(&this->old_extent,output);
  Point::serialize(&this->new_extent,output);
  Point::serialize(&this->old_distance_from_left_ancestor,output);
  Point::serialize(&this->new_distance_from_left_ancestor,output);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->old_text);
  if (bVar1) {
    Serializer::append<unsigned_int>(output,1);
    pTVar2 = std::unique_ptr<Text,_std::default_delete<Text>_>::operator->(&this->old_text);
    Text::serialize(pTVar2,output);
  }
  else {
    Serializer::append<unsigned_int>(output,0);
    Serializer::append<unsigned_int>(output,this->old_text_size_);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->new_text);
  if (bVar1) {
    Serializer::append<unsigned_int>(output,1);
    pTVar2 = std::unique_ptr<Text,_std::default_delete<Text>_>::operator->(&this->new_text);
    Text::serialize(pTVar2,output);
  }
  else {
    Serializer::append<unsigned_int>(output,0);
  }
  return;
}

Assistant:

void serialize(Serializer &output) const {
    old_extent.serialize(output);
    new_extent.serialize(output);
    old_distance_from_left_ancestor.serialize(output);
    new_distance_from_left_ancestor.serialize(output);
    if (old_text) {
      output.append<uint32_t>(1);
      old_text->serialize(output);
    } else {
      output.append<uint32_t>(0);
      output.append<uint32_t>(old_text_size_);
    }
    if (new_text) {
      output.append<uint32_t>(1);
      new_text->serialize(output);
    } else {
      output.append<uint32_t>(0);
    }
  }